

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

BinaryExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::BinaryExpressionSyntax,slang::syntax::SyntaxKind&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::ExpressionSyntax&>
          (BumpAllocator *this,SyntaxKind *args,ExpressionSyntax *args_1,Token *args_2,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_3,ExpressionSyntax *args_4)

{
  Token operatorToken;
  BinaryExpressionSyntax *pBVar1;
  ExpressionSyntax *in_RCX;
  undefined8 in_RDX;
  SyntaxKind kind;
  BinaryExpressionSyntax *in_RSI;
  undefined8 in_RDI;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_R8;
  Info *unaff_retaddr;
  ExpressionSyntax *in_stack_00000010;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  kind = (SyntaxKind)((ulong)in_RDX >> 0x20);
  pBVar1 = (BinaryExpressionSyntax *)
           allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  operatorToken.info = unaff_retaddr;
  operatorToken.kind = (short)in_RDI;
  operatorToken._2_1_ = (char)((ulong)in_RDI >> 0x10);
  operatorToken.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  operatorToken.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::BinaryExpressionSyntax::BinaryExpressionSyntax
            (in_RSI,kind,in_RCX,operatorToken,in_R8,in_stack_00000010);
  return pBVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }